

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.cc
# Opt level: O3

bool __thiscall
sptk::ToeplitzPlusHankelSystemSolver::Run
          (ToeplitzPlusHankelSystemSolver *this,
          vector<double,_std::allocator<double>_> *toeplitz_coefficient_vector,
          vector<double,_std::allocator<double>_> *hankel_coefficient_vector,
          vector<double,_std::allocator<double>_> *constant_vector,
          vector<double,_std::allocator<double>_> *solution_vector,Buffer *buffer)

{
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_00;
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_01;
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  Matrix2D *inverse_matrix;
  Matrix2D *this_04;
  Matrix2D *this_05;
  Matrix2D *output;
  vector<double,_std::allocator<double>_> *output_00;
  Matrix2D *transposed_matrix;
  Matrix2D *output_01;
  vector<double,_std::allocator<double>_> *output_02;
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pMVar4;
  double *pdVar5;
  byte bVar6;
  bool bVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  pointer pvVar12;
  byte bVar13;
  size_type __new_size;
  uint uVar14;
  long lVar16;
  double dVar17;
  ulong local_b8;
  long local_70;
  long local_68;
  ulong uVar15;
  
  if (this->is_valid_ != true) {
    return false;
  }
  uVar1 = this->num_order_;
  uVar14 = uVar1 + 1;
  uVar15 = (ulong)uVar14;
  lVar8 = (long)(toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar8 >> 3 != (long)(int)(uVar14 * 2 + -1)) {
    return false;
  }
  if ((long)(hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl
            .super__Vector_impl_data._M_start != lVar8) {
    return false;
  }
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  if (solution_vector == (vector<double,_std::allocator<double>_> *)0x0) {
    return false;
  }
  lVar8 = (long)(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = lVar8 >> 3;
  if (__new_size != (long)(int)uVar14) {
    return false;
  }
  if ((long)(solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start != lVar8) {
    std::vector<double,_std::allocator<double>_>::resize(solution_vector,__new_size);
  }
  this_00 = &buffer->r_;
  if (((long)(buffer->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(buffer->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - __new_size != 0)
  {
    std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_00,__new_size);
  }
  this_01 = &buffer->x_;
  if (((long)(buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - __new_size != 0)
  {
    std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_01,__new_size);
  }
  this_02 = &buffer->prev_x_;
  if (((long)(buffer->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(buffer->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - __new_size != 0)
  {
    std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_02,__new_size);
  }
  this_03 = &buffer->p_;
  if (((long)(buffer->p_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(buffer->p_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size == 0
     ) {
LAB_0010bae0:
    pdVar2 = (toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    bVar6 = (byte)(uVar1 >> 0x18);
    bVar13 = bVar6 >> 7;
    if (-1 < (int)uVar1) {
      pdVar3 = (hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)this->num_order_;
      pMVar4 = (this_00->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar16 = 0;
      lVar8 = lVar10;
      do {
        *(double *)((long)&pMVar4->data_ + lVar16) = pdVar2[lVar10];
        *(double *)((long)&pMVar4->data_ + lVar16 + 0x18) = pdVar2[lVar8];
        *(double *)((long)&pMVar4->data_ + lVar16 + 8) = pdVar3[lVar10];
        *(double *)((long)&pMVar4->data_ + lVar16 + 0x10) = pdVar3[lVar8];
        lVar8 = lVar8 + -1;
        lVar10 = lVar10 + 1;
        lVar16 = lVar16 + 0x28;
      } while (uVar15 * 0x28 != lVar16);
    }
    if (this->coefficients_modification_ == false) goto LAB_0010bc08;
    uVar14 = this->num_order_;
    dVar17 = pdVar2[(int)uVar14];
    if ((int)uVar1 < 0) goto LAB_0010bbcd;
    pdVar9 = (((this_00->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
               _M_impl.super__Vector_impl_data._M_start)->data_).x_ + 3;
    uVar11 = 0;
    do {
      pdVar9[-3] = pdVar9[-3] + dVar17;
      *pdVar9 = *pdVar9 + dVar17;
      uVar11 = uVar11 + 2;
      pdVar9 = pdVar9 + 10;
      bVar13 = bVar6 >> 7;
    } while (uVar11 <= uVar1);
  }
  else {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(this_03,__new_size);
    if (-1 < (int)uVar1) {
      lVar8 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((this_03->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar8),2);
        lVar8 = lVar8 + 0x18;
      } while (uVar15 * 0x18 != lVar8);
      goto LAB_0010bae0;
    }
    bVar13 = 1;
    if (this->coefficients_modification_ != true) goto LAB_0010bc08;
    uVar14 = this->num_order_;
    dVar17 = (toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start[(int)uVar14];
LAB_0010bbcd:
    bVar13 = 1;
  }
  uVar11 = (ulong)(uVar14 & 1);
  if ((int)(uVar14 & 1) <= (int)uVar1) {
    pdVar9 = (this_00->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11].data_.x_ + 1;
    do {
      *pdVar9 = *pdVar9 - dVar17;
      pdVar9[1] = pdVar9[1] - dVar17;
      uVar11 = uVar11 + 2;
      pdVar9 = pdVar9 + 10;
    } while (uVar11 <= uVar1);
  }
LAB_0010bc08:
  Matrix2D::FillDiagonal
            ((buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
             _M_impl.super__Vector_impl_data._M_start,1.0);
  pdVar2 = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar9 = (buffer->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar9 = *(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pdVar9[1] = pdVar2[-1];
  inverse_matrix = &buffer->inv_;
  bVar7 = Matrix2D::Invert((buffer->r_).
                           super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
                           _M_impl.super__Vector_impl_data._M_start,inverse_matrix);
  if ((!bVar7) ||
     (bVar7 = Matrix2D::Multiply(inverse_matrix,&buffer->bar_,
                                 (this_03->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start), !bVar7)) {
    return false;
  }
  this_04 = &buffer->vx_;
  Matrix2D::operator=(this_04,(buffer->r_).
                              super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if (0 < (int)uVar1) {
    this_05 = &buffer->ex_;
    output = &buffer->tmp_matrix_;
    output_00 = &buffer->tmp_vector_;
    transposed_matrix = &buffer->tau_;
    output_01 = &buffer->bx_;
    output_02 = &buffer->g_;
    local_b8 = 1;
    lVar8 = 0x28;
    local_68 = 0;
    local_70 = 0;
    do {
      Matrix2D::Fill(this_05,0.0);
      lVar16 = 0;
      lVar10 = lVar8;
      do {
        bVar7 = Matrix2D::Multiply((Matrix2D *)
                                   ((long)&((this_00->
                                            super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                           _vptr_Matrix2D + lVar10),
                                   (Matrix2D *)
                                   ((long)&((this_01->
                                            super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                           _vptr_Matrix2D + lVar16),output);
        if (!bVar7) {
          return false;
        }
        bVar7 = Matrix2D::Add(output,this_05);
        if (!bVar7) {
          return false;
        }
        lVar16 = lVar16 + 0x28;
        lVar10 = lVar10 + -0x28;
      } while (lVar10 != 0);
      pdVar2 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar2 = 0.0;
      pdVar2[1] = 0.0;
      lVar16 = 0;
      lVar10 = lVar8;
      do {
        bVar7 = Matrix2D::Multiply((Matrix2D *)
                                   ((long)&((this_00->
                                            super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                           _vptr_Matrix2D + lVar10),
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&(((this_03->
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data + lVar16),output_00);
        if (!bVar7) {
          return false;
        }
        pdVar9 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (buffer->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar9 = *pdVar5 + *pdVar9;
        pdVar9[1] = pdVar5[1] + pdVar9[1];
        lVar16 = lVar16 + 0x18;
        lVar10 = lVar10 + -0x28;
      } while (lVar10 != 0);
      bVar7 = Matrix2D::CrossTranspose(this_04,transposed_matrix);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::Invert(transposed_matrix,inverse_matrix);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::Multiply(inverse_matrix,this_05,output_01);
      if (!bVar7) {
        return false;
      }
      if (1 < local_b8) {
        lVar16 = 0x28;
        lVar10 = local_70;
        do {
          bVar7 = Matrix2D::CrossTranspose
                            ((Matrix2D *)
                             ((long)&((this_02->
                                      super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                             lVar10),transposed_matrix);
          if (!bVar7) {
            return false;
          }
          bVar7 = Matrix2D::Multiply(transposed_matrix,output_01,output);
          if (!bVar7) {
            return false;
          }
          bVar7 = Matrix2D::Subtract(output,(Matrix2D *)
                                            ((long)&((this_01->
                                                                                                          
                                                  super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _vptr_Matrix2D + lVar16));
          if (!bVar7) {
            return false;
          }
          lVar16 = lVar16 + 0x28;
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != 0);
      }
      Matrix2D::Negate((this_01->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_b8,output_01);
      lVar10 = 0x28;
      do {
        Matrix2D::operator=((Matrix2D *)
                            ((long)&((this_02->
                                     super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                            lVar10),(Matrix2D *)
                                    ((long)&((this_01->
                                             super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                            _vptr_Matrix2D + lVar10));
        lVar16 = local_68 + lVar10;
        lVar10 = lVar10 + 0x28;
      } while (lVar16 != 0x28);
      bVar7 = Matrix2D::CrossTranspose(this_05,transposed_matrix);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::Multiply(transposed_matrix,output_01,output);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::Subtract(output,this_04);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::CrossTranspose(this_04,transposed_matrix);
      if (!bVar7) {
        return false;
      }
      bVar7 = Matrix2D::Invert(transposed_matrix,inverse_matrix);
      if (!bVar7) {
        return false;
      }
      pdVar2 = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar9 = (buffer->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar17 = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_b8];
      *pdVar9 = dVar17;
      pdVar9[1] = pdVar2[~local_b8];
      pdVar5 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (buffer->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar2 = dVar17 - *pdVar5;
      pdVar2[1] = pdVar9[1] - pdVar5[1];
      bVar7 = Matrix2D::Multiply(inverse_matrix,output_00,output_02);
      if (!bVar7) {
        return false;
      }
      lVar16 = 0;
      lVar10 = lVar8;
      do {
        bVar7 = Matrix2D::CrossTranspose
                          ((Matrix2D *)
                           ((long)&((this_01->
                                    super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                           lVar10),transposed_matrix);
        if (!bVar7) {
          return false;
        }
        bVar7 = Matrix2D::Multiply(transposed_matrix,output_02,output_00);
        if (!bVar7) {
          return false;
        }
        pdVar9 = (output_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar12 = (this_03->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = *(double **)
                  ((long)&(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar16);
        *pdVar5 = *pdVar9 + *pdVar5;
        pdVar5[1] = pdVar9[1] + pdVar5[1];
        lVar16 = lVar16 + 0x18;
        lVar10 = lVar10 + -0x28;
      } while (lVar10 != 0);
      std::vector<double,_std::allocator<double>_>::operator=(pvVar12 + local_b8,output_02);
      local_b8 = local_b8 + 1;
      lVar8 = lVar8 + 0x28;
      local_70 = local_70 + 0x28;
      local_68 = local_68 + -0x28;
    } while (local_b8 != uVar15);
  }
  if (bVar13 == 0) {
    pdVar2 = (solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar12 = (this_03->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      pdVar2[uVar11] =
           *(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
      pvVar12 = pvVar12 + 1;
    } while (uVar15 != uVar11);
    return true;
  }
  return true;
}

Assistant:

bool ToeplitzPlusHankelSystemSolver::Run(
    const std::vector<double>& toeplitz_coefficient_vector,
    const std::vector<double>& hankel_coefficient_vector,
    const std::vector<double>& constant_vector,
    std::vector<double>* solution_vector,
    ToeplitzPlusHankelSystemSolver::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      toeplitz_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      hankel_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      constant_vector.size() != static_cast<std::size_t>(length) ||
      NULL == solution_vector || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (solution_vector->size() != static_cast<std::size_t>(length)) {
    solution_vector->resize(length);
  }
  if (buffer->r_.size() != static_cast<std::size_t>(length)) {
    buffer->r_.resize(length);
  }
  if (buffer->x_.size() != static_cast<std::size_t>(length)) {
    buffer->x_.resize(length);
  }
  if (buffer->prev_x_.size() != static_cast<std::size_t>(length)) {
    buffer->prev_x_.resize(length);
  }
  if (buffer->p_.size() != static_cast<std::size_t>(length)) {
    buffer->p_.resize(length);
    for (int i(0); i < length; ++i) {
      buffer->p_[i].resize(2);
    }
  }

  // Step 0)
  {
    // Set R.
    const double* t(&(toeplitz_coefficient_vector[0]));
    const double* h(&(hankel_coefficient_vector[0]));
    for (int i(0); i < length; ++i) {
      buffer->r_[i][0][0] = t[num_order_ + i];
      buffer->r_[i][1][1] = t[num_order_ - i];
      buffer->r_[i][0][1] = h[num_order_ + i];
      buffer->r_[i][1][0] = h[num_order_ - i];
    }

    if (coefficients_modification_) {
      const double d0(t[num_order_]);
      for (int i(0); i < length; i += 2) {
        buffer->r_[i][0][0] += d0;
        buffer->r_[i][1][1] += d0;
      }
      for (int i((0 == num_order_ % 2) ? 0 : 1); i < length; i += 2) {
        buffer->r_[i][0][1] -= d0;
        buffer->r_[i][1][0] -= d0;
      }
    }
  }

  // Step 1)
  {
    // Set X_0.
    buffer->x_[0].FillDiagonal(1.0);

    // Set p_0.
    PutBar(0, constant_vector, &buffer->bar_);
    if (!buffer->r_[0].Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->bar_, &buffer->p_[0])) {
      return false;
    }

    // Set V_x.
    buffer->vx_ = buffer->r_[0];
  }

  // Step 2)
  for (int i(1); i < length; ++i) {
    // a) Calculate E_x.
    buffer->ex_.Fill(0.0);
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->x_[j],
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Add(buffer->tmp_matrix_, &buffer->ex_)) {
        return false;
      }
    }

    // b) Calculate \bar{e}_p.
    buffer->ep_[0] = 0.0;
    buffer->ep_[1] = 0.0;
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->p_[j],
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->ep_[0] += buffer->tmp_vector_[0];
      buffer->ep_[1] += buffer->tmp_vector_[1];
    }

    // c) Calculate B_x.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->ex_, &buffer->bx_)) {
      return false;
    }

    // d) Update X.
    for (int j(1); j < i; ++j) {
      if (!buffer->prev_x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->x_[j])) {
        return false;
      }
    }
    buffer->x_[i].Negate(buffer->bx_);
    for (int j(1); j <= i; ++j) {
      buffer->prev_x_[j] = buffer->x_[j];
    }

    // d) Update V_x.
    if (!buffer->ex_.CrossTranspose(&buffer->tau_) ||
        !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                  &buffer->tmp_matrix_) ||
        !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->vx_)) {
      return false;
    }

    // e) Calculate \bar{g}.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_)) {
      return false;
    }
    PutBar(i, constant_vector, &buffer->bar_);
    buffer->tmp_vector_[0] = buffer->bar_[0] - buffer->ep_[0];
    buffer->tmp_vector_[1] = buffer->bar_[1] - buffer->ep_[1];
    if (!sptk::Matrix2D::Multiply(buffer->inv_, buffer->tmp_vector_,
                                  &buffer->g_)) {
      return false;
    }

    // f) Update \bar{p}.
    for (int j(0); j < i; ++j) {
      if (!buffer->x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->g_,
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->p_[j][0] += buffer->tmp_vector_[0];
      buffer->p_[j][1] += buffer->tmp_vector_[1];
    }
    buffer->p_[i] = buffer->g_;
  }

  // Step 3)
  {
    double* a(&((*solution_vector)[0]));
    for (int i(0); i < length; ++i) {
      a[i] = buffer->p_[i][0];
    }
  }

  return true;
}